

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall enact::Lexer::skipWhitespace(Lexer *this)

{
  char cVar1;
  bool bVar2;
  byte local_29;
  char c;
  Lexer *this_local;
  
  do {
    cVar1 = peek(this);
    switch(cVar1) {
    case '\n':
      this->m_line = this->m_line + 1;
    case '\t':
    case '\r':
    case ' ':
      advance(this);
      break;
    default:
      return;
    case '/':
      cVar1 = peekNext(this);
      if (cVar1 == '/') {
        while( true ) {
          cVar1 = peek(this);
          local_29 = 0;
          if (cVar1 != '\n') {
            bVar2 = isAtEnd(this);
            local_29 = bVar2 ^ 0xff;
          }
          if ((local_29 & 1) == 0) break;
          advance(this);
        }
        return;
      }
      return;
    }
  } while( true );
}

Assistant:

void Lexer::skipWhitespace() {
        while (true) {
            char c = peek();
            switch (c) {
                case '\n':
                    ++m_line;
                    // Fallthrough
                case ' ':
                case '\t':
                case '\r':
                    advance();
                    break;

                case '/':
                    if (peekNext() == '/') {
                        while (peek() != '\n' && !isAtEnd()) advance();
                    } else {
                        return;
                    }

                default:
                    return;
            }
        }
    }